

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties2
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  VkDeviceSize *pImageFormatProperties;
  VkPhysicalDevice pVVar1;
  RefData<vk::VkInstance_s_*> data;
  VkAllocationCallbacks *platformInterface;
  deBool dVar2;
  int iVar3;
  TestContext *this;
  TestLog *pTVar4;
  VkInstance_s **ppVVar5;
  VkPhysicalDevice pVVar6;
  const_reference ppVVar7;
  TestError *pTVar8;
  MessageBuilder *pMVar9;
  allocator<char> local_771;
  string local_770;
  MessageBuilder local_750;
  MessageBuilder local_5d0;
  MessageBuilder local_450;
  VkResult local_2d0;
  VkResult local_2cc;
  VkResult extResult;
  VkResult coreResult;
  VkImageFormatProperties2KHR extProperties;
  VkImageFormatProperties coreProperties;
  VkPhysicalDeviceImageFormatInfo2KHR imageFormatInfo;
  VkImageCreateFlags curCreateFlags;
  VkImageUsageFlags curUsageFlags;
  VkPhysicalDevice physicalDevice;
  size_t deviceNdx;
  VkImageCreateFlags allCreateFlags;
  VkImageUsageFlags allUsageFlags;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_80;
  RefData<vk::VkInstance_s_*> local_68;
  undefined1 local_50 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  TestLog *log;
  VkImageTiling tiling_local;
  VkImageType imageType_local;
  VkFormat format_local;
  Context *context_local;
  
  this = Context::getTestContext(context);
  pTVar4 = tcu::TestContext::getLog(this);
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_80,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_80);
  data.deleter.m_destroyInstance = local_68.deleter.m_destroyInstance;
  data.object = local_68.object;
  data.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_50,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_80);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_50);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (PlatformInterface *)platformInterface,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)local_50);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &allCreateFlags,
             (InstanceInterface *)
             &devices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar5);
  deviceNdx._4_4_ = 0xff;
  deviceNdx._0_4_ = 0x1f;
  physicalDevice = (VkPhysicalDevice)0x0;
  do {
    pVVar1 = physicalDevice;
    pVVar6 = (VkPhysicalDevice)
             std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                       ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         *)&allCreateFlags);
    if (pVVar6 <= pVVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_770,"Querying image format properties succeeded",&local_771);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator(&local_771);
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &allCreateFlags);
      ::vk::InstanceDriver::~InstanceDriver
                ((InstanceDriver *)
                 &devices.
                  super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_50);
      return __return_storage_ptr__;
    }
    ppVVar7 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
              operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          *)&allCreateFlags,(size_type)physicalDevice);
    pVVar1 = *ppVVar7;
    for (imageFormatInfo._36_4_ = 1; (uint)imageFormatInfo._36_4_ < 0x100;
        imageFormatInfo._36_4_ = imageFormatInfo._36_4_ + 1) {
      for (imageFormatInfo.flags = 0; imageFormatInfo.flags < 0x20;
          imageFormatInfo.flags = imageFormatInfo.flags + 1) {
        coreProperties.maxResourceSize._0_4_ = 0x3b9bb07c;
        pImageFormatProperties = &extProperties.imageFormatProperties.maxResourceSize;
        ::deMemset(pImageFormatProperties,0xcd,0x20);
        ::deMemset(&extResult,0xcd,0x30);
        extResult = 0x3b9bb07b;
        extProperties.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        extProperties._4_4_ = 0;
        local_2cc = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties
                              ((InstanceDriver *)
                               &devices.
                                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar1,format,
                               imageType,tiling,imageFormatInfo._36_4_,imageFormatInfo.flags,
                               (VkImageFormatProperties *)pImageFormatProperties);
        local_2d0 = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties2KHR
                              ((InstanceDriver *)
                               &devices.
                                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar1,
                               (VkPhysicalDeviceImageFormatInfo2KHR *)
                               &coreProperties.maxResourceSize,
                               (VkImageFormatProperties2KHR *)&extResult);
        do {
          dVar2 = ::deGetFalse();
          if ((dVar2 != 0) || (extResult != 0x3b9bb07b)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,
                       "extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x994);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        do {
          dVar2 = ::deGetFalse();
          if ((dVar2 != 0) || (extProperties._0_8_ != 0)) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,(char *)0x0,"extProperties.pNext == DE_NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                       ,0x995);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        if ((local_2cc != local_2d0) ||
           (iVar3 = deMemCmp(&extProperties.imageFormatProperties.maxResourceSize,
                             &extProperties.pNext,0x20), iVar3 != 0)) {
          tcu::TestLog::operator<<(&local_750,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_750,(char (*) [15])"ERROR: device ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(unsigned_long *)&physicalDevice);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [23])": mismatch with query ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(VkPhysicalDeviceImageFormatInfo2KHR *)
                                     &coreProperties.maxResourceSize);
          pTVar4 = tcu::MessageBuilder::operator<<
                             (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_5d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_5d0,
                              (char (*) [53])"vkGetPhysicalDeviceImageFormatProperties() returned ")
          ;
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2cc);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(VkImageFormatProperties *)
                                     &extProperties.imageFormatProperties.maxResourceSize);
          pTVar4 = tcu::MessageBuilder::operator<<
                             (pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_450,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_450,
                              (char (*) [57])
                              "vkGetPhysicalDeviceImageFormatProperties2KHR() returned ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2d0);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(VkImageFormatProperties2KHR *)&extResult)
          ;
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_450);
          tcu::MessageBuilder::~MessageBuilder(&local_5d0);
          tcu::MessageBuilder::~MessageBuilder(&local_750);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x99d);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
    }
    physicalDevice = physicalDevice + 1;
  } while( true );
}

Assistant:

tcu::TestStatus imageFormatProperties2 (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log				= context.getTestContext().getLog();

	const PlatformInterface&		vkp				= context.getPlatformInterface();
	const Unique<VkInstance>		instance		(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki				(vkp, *instance);
	const vector<VkPhysicalDevice>	devices			= enumeratePhysicalDevices(vki, *instance);

	const VkImageUsageFlags			allUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT
													| VK_IMAGE_USAGE_TRANSFER_DST_BIT
													| VK_IMAGE_USAGE_SAMPLED_BIT
													| VK_IMAGE_USAGE_STORAGE_BIT
													| VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
	const VkImageCreateFlags		allCreateFlags	= VK_IMAGE_CREATE_SPARSE_BINDING_BIT
													| VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT
													| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT
													| VK_IMAGE_CREATE_MUTABLE_FORMAT_BIT
													| VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice	= devices[deviceNdx];

		for (VkImageUsageFlags curUsageFlags = (VkImageUsageFlags)1; curUsageFlags <= allUsageFlags; curUsageFlags++)
		{
			for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= allCreateFlags; curCreateFlags++)
			{
				const VkPhysicalDeviceImageFormatInfo2KHR	imageFormatInfo	=
				{
					VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_FORMAT_INFO_2_KHR,
					DE_NULL,
					format,
					imageType,
					tiling,
					curUsageFlags,
					curCreateFlags
				};

				VkImageFormatProperties						coreProperties;
				VkImageFormatProperties2KHR					extProperties;
				VkResult									coreResult;
				VkResult									extResult;

				deMemset(&coreProperties, 0xcd, sizeof(VkImageFormatProperties));
				deMemset(&extProperties, 0xcd, sizeof(VkImageFormatProperties2KHR));

				extProperties.sType = VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR;
				extProperties.pNext = DE_NULL;

				coreResult	= vki.getPhysicalDeviceImageFormatProperties(physicalDevice, imageFormatInfo.format, imageFormatInfo.type, imageFormatInfo.tiling, imageFormatInfo.usage, imageFormatInfo.flags, &coreProperties);
				extResult	= vki.getPhysicalDeviceImageFormatProperties2KHR(physicalDevice, &imageFormatInfo, &extProperties);

				TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties.pNext == DE_NULL);

				if ((coreResult != extResult) ||
					(deMemCmp(&coreProperties, &extProperties.imageFormatProperties, sizeof(VkImageFormatProperties)) != 0))
				{
					log << TestLog::Message << "ERROR: device " << deviceNdx << ": mismatch with query " << imageFormatInfo << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties() returned " << coreResult << ", " << coreProperties << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties2KHR() returned " << extResult << ", " << extProperties << TestLog::EndMessage;
					TCU_FAIL("Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR");
				}
			}
		}
	}

	return tcu::TestStatus::pass("Querying image format properties succeeded");
}